

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O2

int pageant_enum_keys(pageant_key_enum_fn_t callback,void *callback_ctx,char **retstr)

{
  KeyList *kl;
  char *pcVar1;
  KeyList *kl_00;
  char **ppcVar2;
  size_t i;
  ulong uVar3;
  int iVar4;
  long lVar5;
  ptrlen string;
  ptrlen pl;
  ptrlen string_00;
  ptrlen pl_00;
  ptrlen blob;
  pageant_pubkey cbkey;
  BinarySource src [1];
  RSAKey rkey;
  
  iVar4 = 1;
  kl = pageant_get_keylist(1);
  if ((kl == (KeyList *)0x0) || (kl->broken != true)) {
    kl_00 = pageant_get_keylist(2);
    if ((kl_00 == (KeyList *)0x0) || (kl_00->broken != true)) {
      if (kl != (KeyList *)0x0) {
        lVar5 = 0;
        for (uVar3 = 0; uVar3 < kl->nkeys; uVar3 = uVar3 + 1) {
          string.len = *(size_t *)((long)&(kl->keys->blob).len + lVar5);
          string.ptr = *(void **)((long)&(kl->keys->blob).ptr + lVar5);
          cbkey.blob = strbuf_dup(string);
          pl.len = *(size_t *)((long)&(kl->keys->comment).len + lVar5);
          pl.ptr = *(void **)((long)&(kl->keys->comment).ptr + lVar5);
          cbkey.comment = mkstr(pl);
          cbkey.ssh_version = 1;
          rkey.iqmp = (mp_int *)0x0;
          rkey.comment = (char *)0x0;
          rkey.p = (mp_int *)0x0;
          rkey.q = (mp_int *)0x0;
          rkey.exponent = (mp_int *)0x0;
          rkey.private_exponent = (mp_int *)0x0;
          rkey.bits = 0;
          rkey.bytes = 0;
          rkey.modulus = (mp_int *)0x0;
          rkey.sshk.vt = (ssh_keyalg *)0x0;
          src[0].data = *(void **)((long)&(kl->keys->blob).ptr + lVar5);
          src[0].len = *(size_t *)((long)&(kl->keys->blob).len + lVar5);
          src[0].pos = 0;
          src[0].err = BSE_NO_ERROR;
          src[0].binarysource_ = src;
          BinarySource_get_rsa_ssh1_pub(src[0].binarysource_,&rkey,RSA_SSH1_EXPONENT_FIRST);
          if ((src[0].binarysource_)->err != BSE_NO_ERROR) {
            pcVar1 = dupstr("Received an invalid SSH-1 key from agent");
            *retstr = pcVar1;
            iVar4 = 1;
            goto LAB_001140b1;
          }
          ppcVar2 = rsa_ssh1_fake_all_fingerprints(&rkey);
          freersakey(&rkey);
          (*callback)(callback_ctx,ppcVar2,cbkey.comment,
                      *(uint32_t *)((long)&kl->keys->flags + lVar5),&cbkey);
          strbuf_free(cbkey.blob);
          safefree(cbkey.comment);
          ssh2_free_all_fingerprints(ppcVar2);
          lVar5 = lVar5 + 0x28;
        }
      }
      if (kl_00 != (KeyList *)0x0) {
        lVar5 = 0;
        for (uVar3 = 0; uVar3 < kl_00->nkeys; uVar3 = uVar3 + 1) {
          string_00.len = *(size_t *)((long)&(kl_00->keys->blob).len + lVar5);
          string_00.ptr = *(void **)((long)&(kl_00->keys->blob).ptr + lVar5);
          cbkey.blob = strbuf_dup(string_00);
          pl_00.len = *(size_t *)((long)&(kl_00->keys->comment).len + lVar5);
          pl_00.ptr = *(void **)((long)&(kl_00->keys->comment).ptr + lVar5);
          cbkey.comment = mkstr(pl_00);
          cbkey.ssh_version = 2;
          blob.len = *(size_t *)((long)&(kl_00->keys->blob).len + lVar5);
          blob.ptr = *(void **)((long)&(kl_00->keys->blob).ptr + lVar5);
          ppcVar2 = ssh2_all_fingerprints_for_blob(blob);
          (*callback)(callback_ctx,ppcVar2,cbkey.comment,
                      *(uint32_t *)((long)&kl_00->keys->flags + lVar5),&cbkey);
          ssh2_free_all_fingerprints(ppcVar2);
          safefree(cbkey.comment);
          strbuf_free(cbkey.blob);
          lVar5 = lVar5 + 0x28;
        }
      }
      pcVar1 = (char *)0x0;
      iVar4 = 0;
    }
    else {
      pcVar1 = dupstr("Received broken SSH-2 key list from agent");
      iVar4 = 1;
    }
    *retstr = pcVar1;
    if (kl == (KeyList *)0x0) goto LAB_001140b9;
  }
  else {
    pcVar1 = dupstr("Received broken SSH-1 key list from agent");
    *retstr = pcVar1;
    kl_00 = (KeyList *)0x0;
  }
LAB_001140b1:
  keylist_free(kl);
LAB_001140b9:
  if (kl_00 != (KeyList *)0x0) {
    keylist_free(kl_00);
  }
  return iVar4;
}

Assistant:

int pageant_enum_keys(pageant_key_enum_fn_t callback, void *callback_ctx,
                      char **retstr)
{
    KeyList *kl1 = NULL, *kl2 = NULL;
    struct pageant_pubkey cbkey;
    int toret = PAGEANT_ACTION_FAILURE;

    kl1 = pageant_get_keylist(1);
    if (kl1 && kl1->broken) {
        *retstr = dupstr("Received broken SSH-1 key list from agent");
        goto out;
    }

    kl2 = pageant_get_keylist(2);
    if (kl2 && kl2->broken) {
        *retstr = dupstr("Received broken SSH-2 key list from agent");
        goto out;
    }

    if (kl1) {
        for (size_t i = 0; i < kl1->nkeys; i++) {
            cbkey.blob = strbuf_dup(kl1->keys[i].blob);
            cbkey.comment = mkstr(kl1->keys[i].comment);
            cbkey.ssh_version = 1;

            /* Decode public blob into a key in order to fingerprint it */
            RSAKey rkey;
            memset(&rkey, 0, sizeof(rkey));
            {
                BinarySource src[1];
                BinarySource_BARE_INIT_PL(src, kl1->keys[i].blob);
                get_rsa_ssh1_pub(src, &rkey, RSA_SSH1_EXPONENT_FIRST);
                if (get_err(src)) {
                    *retstr = dupstr(
                        "Received an invalid SSH-1 key from agent");
                    goto out;
                }
            }
            char **fingerprints = rsa_ssh1_fake_all_fingerprints(&rkey);
            freersakey(&rkey);

            callback(callback_ctx, fingerprints, cbkey.comment,
                     kl1->keys[i].flags, &cbkey);

            strbuf_free(cbkey.blob);
            sfree(cbkey.comment);
            ssh2_free_all_fingerprints(fingerprints);
        }
    }

    if (kl2) {
        for (size_t i = 0; i < kl2->nkeys; i++) {
            cbkey.blob = strbuf_dup(kl2->keys[i].blob);
            cbkey.comment = mkstr(kl2->keys[i].comment);
            cbkey.ssh_version = 2;

            char **fingerprints =
                ssh2_all_fingerprints_for_blob(kl2->keys[i].blob);

            callback(callback_ctx, fingerprints, cbkey.comment,
                     kl2->keys[i].flags, &cbkey);

            ssh2_free_all_fingerprints(fingerprints);
            sfree(cbkey.comment);
            strbuf_free(cbkey.blob);
        }
    }

    *retstr = NULL;
    toret = PAGEANT_ACTION_OK;
  out:
    if (kl1)
        keylist_free(kl1);
    if (kl2)
        keylist_free(kl2);
    return toret;
}